

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

CharClassBuilder * __thiscall re2::CharClassBuilder::Copy(CharClassBuilder *this)

{
  uint32_t uVar1;
  CharClassBuilder *pCVar2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  RuneRange local_38;
  
  pCVar2 = (CharClassBuilder *)operator_new(0x40);
  p_Var3 = &(pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header;
  (pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (pCVar2->ranges_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar2->nrunes_ = 0;
  pCVar2->upper_ = 0;
  pCVar2->lower_ = 0;
  p_Var4 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var3 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var3) {
    do {
      local_38.lo = p_Var4[1]._M_color;
      local_38.hi = *(Rune *)&p_Var4[1].field_0x4;
      std::
      _Rb_tree<re2::RuneRange,_re2::RuneRange,_std::_Identity<re2::RuneRange>,_re2::RuneRangeLess,_std::allocator<re2::RuneRange>_>
      ::_M_insert_unique<re2::RuneRange>(&(pCVar2->ranges_)._M_t,&local_38);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != p_Var3);
  }
  uVar1 = this->lower_;
  pCVar2->upper_ = this->upper_;
  pCVar2->lower_ = uVar1;
  pCVar2->nrunes_ = this->nrunes_;
  return pCVar2;
}

Assistant:

CharClassBuilder* CharClassBuilder::Copy() {
  CharClassBuilder* cc = new CharClassBuilder;
  for (iterator it = begin(); it != end(); ++it)
    cc->ranges_.insert(RuneRange(it->lo, it->hi));
  cc->upper_ = upper_;
  cc->lower_ = lower_;
  cc->nrunes_ = nrunes_;
  return cc;
}